

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode InitiateTransfer(Curl_easy *data)

{
  byte *pbVar1;
  connectdata *pcVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  curl_off_t recv_size;
  int send_recv;
  bool bVar5;
  _Bool connected;
  _Bool local_19;
  
  pcVar2 = data->conn;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < Curl_trc_feat_ftp.log_level)) {
    Curl_trc_ftp(data,"InitiateTransfer()");
  }
  CVar4 = Curl_conn_connect(data,1,true,&local_19);
  if ((CVar4 == CURLE_OK) && (local_19 == true)) {
    bVar5 = (pcVar2->proto).ftpc.state_saved != '!';
    if (bVar5) {
      recv_size = (pcVar2->proto).ftpc.retr_size_saved;
      send_recv = 1;
    }
    else {
      Curl_pgrsSetUploadSize(data,(data->state).infilesize);
      send_recv = 2;
      recv_size = -1;
    }
    Curl_xfer_setup2(data,send_recv,recv_size,true,!bVar5);
    pbVar1 = (byte *)((long)&pcVar2->proto + 0x98);
    *pbVar1 = *pbVar1 | 2;
    CVar4 = CURLE_OK;
    _ftp_state(data,'\0');
  }
  return CVar4;
}

Assistant:

static CURLcode InitiateTransfer(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  bool connected;

  CURL_TRC_FTP(data, "InitiateTransfer()");
  result = Curl_conn_connect(data, SECONDARYSOCKET, TRUE, &connected);
  if(result || !connected)
    return result;

  if(conn->proto.ftpc.state_saved == FTP_STOR) {
    /* When we know we are uploading a specified file, we can get the file
       size prior to the actual upload. */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

    /* set the SO_SNDBUF for the secondary socket for those who need it */
    Curl_sndbuf_init(conn->sock[SECONDARYSOCKET]);

    /* FTP upload, shutdown DATA, ignore shutdown errors, as we rely
     * on the server response on the CONTROL connection. */
    Curl_xfer_setup2(data, CURL_XFER_SEND, -1, TRUE, TRUE);
  }
  else {
    /* FTP download, shutdown, do not ignore errors */
    Curl_xfer_setup2(data, CURL_XFER_RECV,
                     conn->proto.ftpc.retr_size_saved, TRUE, FALSE);
  }

  conn->proto.ftpc.pp.pending_resp = TRUE; /* expect server response */
  ftp_state(data, FTP_STOP);

  return CURLE_OK;
}